

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

void __thiscall
t_ocaml_generator::generate_service_helpers(t_ocaml_generator *this,t_service *tservice)

{
  ostream *poVar1;
  pointer pptVar2;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_30;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_30,&tservice->functions_)
  ;
  poVar1 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar1 = std::operator<<(poVar1,"(* HELPER FUNCTIONS AND STRUCTURES *)");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  for (pptVar2 = local_30._M_impl.super__Vector_impl_data._M_start;
      pptVar2 != local_30._M_impl.super__Vector_impl_data._M_finish; pptVar2 = pptVar2 + 1) {
    generate_ocaml_struct_definition(this,(ostream *)&this->f_service_,(*pptVar2)->arglist_,false);
    generate_ocaml_function_helpers(this,*pptVar2);
  }
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

void t_ocaml_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  indent(f_service_) << "(* HELPER FUNCTIONS AND STRUCTURES *)" << endl << endl;

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* ts = (*f_iter)->get_arglist();
    generate_ocaml_struct_definition(f_service_, ts, false);
    generate_ocaml_function_helpers(*f_iter);
  }
}